

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O3

void __thiscall
HighsSymmetryDetection::backtrack
          (HighsSymmetryDetection *this,HighsInt backtrackStackNewEnd,HighsInt backtrackStackEnd)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  HighsInt HVar4;
  long lVar5;
  
  if (backtrackStackNewEnd < backtrackStackEnd) {
    lVar5 = (long)backtrackStackEnd;
    do {
      iVar1 = (this->cellCreationStack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar5 + -1];
      lVar5 = lVar5 + -1;
      HVar4 = getCellStart(this,iVar1 + -1);
      piVar3 = (this->currentPartitionLinks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar2 = piVar3[iVar1];
      piVar3[iVar1] = HVar4;
      piVar3[HVar4] = iVar2;
    } while (backtrackStackNewEnd < lVar5);
  }
  return;
}

Assistant:

void HighsSymmetryDetection::backtrack(HighsInt backtrackStackNewEnd,
                                       HighsInt backtrackStackEnd) {
  // we assume that we always backtrack from a leaf node, i.e. a discrete
  // partition therefore we do not need to remember the values of the hash
  // contributions as it is the indentity for each position and all new cells
  // are on the cell creation stack.
  for (HighsInt stackPos = backtrackStackEnd - 1;
       stackPos >= backtrackStackNewEnd; --stackPos) {
    HighsInt cell = cellCreationStack[stackPos];
    // look up the cell start of the preceding cell with link compression
    HighsInt newStart = getCellStart(cell - 1);
    // remember the current end
    HighsInt currEnd = currentPartitionLinks[cell];
    // change the link to point to the start of the preceding cell
    currentPartitionLinks[cell] = newStart;
    // change the link of the start pointer of the preceding cell to point to
    // the end of this cell
    currentPartitionLinks[newStart] = currEnd;
  }
}